

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O1

bool __thiscall
cmArchiveWrite::Add(cmArchiveWrite *this,string *path,size_t skip,char *prefix,bool recursive)

{
  size_type sVar1;
  pointer pcVar2;
  
  if ((this->Error)._M_string_length == 0) {
    sVar1 = path->_M_string_length;
    if ((sVar1 != 0) && (pcVar2 = (path->_M_dataplus)._M_p, pcVar2[sVar1 - 1] == '/')) {
      path->_M_string_length = sVar1 - 1;
      pcVar2[sVar1 - 1] = '\0';
    }
    AddPath(this,(path->_M_dataplus)._M_p,skip,prefix,recursive);
  }
  return (this->Error)._M_string_length == 0;
}

Assistant:

bool cmArchiveWrite::Add(std::string path, size_t skip, const char* prefix,
                         bool recursive)
{
  if (this->Okay()) {
    if (!path.empty() && path[path.size() - 1] == '/') {
      path.erase(path.size() - 1);
    }
    this->AddPath(path.c_str(), skip, prefix, recursive);
  }
  return this->Okay();
}